

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O1

TPZGeoMesh * __thiscall TPZAcademicGeoMesh::PyramidalAndTetrahedralMesh(TPZAcademicGeoMesh *this)

{
  uint uVar1;
  TPZAcademicGeoMesh *this_00;
  long lVar2;
  TPZGeoMesh *this_01;
  long lVar3;
  long lVar4;
  int il;
  int (*paiVar5) [5];
  int (*paiVar6) [4];
  bool bVar7;
  TPZManVector<long,_5> elnodes;
  int64_t index;
  long local_130;
  TPZVec<long> local_120;
  _func_int **local_100 [5];
  TPZVec<long> local_d8;
  long lStack_b8;
  long local_b0;
  long lStack_a8;
  long local_a0;
  long lStack_98;
  long local_90;
  long lStack_88;
  long local_80;
  TPZAcademicGeoMesh *local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  undefined1 local_38 [8];
  
  lVar4 = this->fNumberElements;
  uVar1 = this->fMaterialId;
  this_01 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(this_01);
  this_01->fDim = 3;
  local_78 = this;
  GenerateNodes(this,this_01);
  if (0 < lVar4) {
    local_70 = lVar4 + 1;
    local_58 = local_70 * local_70;
    local_130 = 0;
    local_60 = lVar4;
    do {
      local_68 = 0;
      do {
        local_48 = local_68 * local_70 + local_130;
        local_68 = local_68 + 1;
        local_50 = local_68 * local_70 + local_130;
        lVar4 = 0;
        do {
          TPZVec<long>::TPZVec(&local_d8,0);
          local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840b58;
          local_d8.fStore = &lStack_b8;
          local_d8.fNElements = 8;
          local_d8.fNAlloc = 0;
          lVar3 = local_58 * lVar4;
          lStack_b8 = local_48 + lVar3;
          local_b0 = local_48 + lVar3 + 1;
          local_a0 = local_50 + lVar3;
          lStack_a8 = lVar3 + local_50 + 1;
          local_40 = lVar4 + 1;
          lStack_88 = local_58 * local_40;
          lStack_98 = local_48 + lStack_88;
          local_90 = local_48 + lStack_88 + 1;
          local_80 = local_50 + lStack_88;
          lStack_88 = local_50 + 1 + lStack_88;
          paiVar6 = tetraedra;
          paiVar5 = pyramid;
          lVar3 = 0;
          do {
            TPZVec<long>::TPZVec(&local_120,0);
            local_120._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018b52d0;
            local_120.fStore = (long *)local_100;
            local_120.fNElements = 5;
            local_120.fNAlloc = 0;
            lVar4 = 4;
            do {
              (&local_120._vptr_TPZVec)[lVar4] =
                   (_func_int **)local_d8.fStore[paiVar5[-1][lVar4 + 1]];
              lVar4 = lVar4 + 1;
            } while (lVar4 != 9);
            (*(this_01->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (this_01,5,&local_120,(ulong)uVar1,local_38,1);
            (*local_120._vptr_TPZVec[3])(&local_120,4);
            lVar4 = 0;
            do {
              local_120.fStore[lVar4] = (long)local_d8.fStore[(*paiVar6)[lVar4]];
              lVar4 = lVar4 + 1;
            } while (lVar4 != 4);
            (*(this_01->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (this_01,4,&local_120,(ulong)uVar1,local_38,1);
            if ((_func_int ***)local_120.fStore == local_100) {
              local_120.fStore = (long *)0x0;
            }
            local_120.fNAlloc = 0;
            local_120._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
            if ((_func_int ***)local_120.fStore != (_func_int ***)0x0) {
              operator_delete__(local_120.fStore);
            }
            lVar4 = local_40;
            lVar2 = local_60;
            paiVar5 = paiVar5 + 1;
            paiVar6 = paiVar6 + 1;
            bVar7 = lVar3 == 0;
            lVar3 = lVar3 + 1;
          } while (bVar7);
          if (local_d8.fStore == &lStack_b8) {
            local_d8.fStore = (long *)0x0;
          }
          local_d8.fNAlloc = 0;
          local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
          if (local_d8.fStore != (long *)0x0) {
            operator_delete__(local_d8.fStore);
          }
        } while (lVar4 != lVar2);
      } while (local_68 != lVar2);
      local_130 = local_130 + 1;
    } while (local_130 != lVar2);
  }
  TPZGeoMesh::BuildConnectivity(this_01);
  this_00 = local_78;
  AddBoundaryElementsByCoord(local_78,this_01);
  if (this_00->fShouldDeform != false) {
    DeformGMesh(this_00,this_01);
  }
  return this_01;
}

Assistant:

TPZGeoMesh *TPZAcademicGeoMesh::PyramidalAndTetrahedralMesh()
{
    int64_t nelem = fNumberElements;
    int MaterialId = fMaterialId;
    TPZGeoMesh *gmesh = new TPZGeoMesh;
    const int dim = 3;
    gmesh->SetDimension(dim);
    GenerateNodes(gmesh);
  
    for (int64_t i=0; i<nelem; i++) {
        for (int64_t j=0; j<nelem; j++) {
            for (int64_t k=0; k<nelem; k++) {
                TPZManVector<int64_t,8> nodes(8,0);
                nodes[0] = k*(nelem+1)*(nelem+1)+j*(nelem+1)+i;
                nodes[1] = k*(nelem+1)*(nelem+1)+j*(nelem+1)+i+1;
                nodes[2] = k*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i+1;
                nodes[3] = k*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i;
                nodes[4] = (k+1)*(nelem+1)*(nelem+1)+j*(nelem+1)+i;
                nodes[5] = (k+1)*(nelem+1)*(nelem+1)+j*(nelem+1)+i+1;
                nodes[6] = (k+1)*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i+1;
                nodes[7] = (k+1)*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i;
#ifdef PZ_LOG
                if(logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "Pyramid and tetrahedral nodes " << nodes;
                    LOGPZ_DEBUG(logger, sout.str())
                }
#endif
                for (int el=0; el<2; el++)
                {
                    TPZManVector<int64_t,5> elnodes(5);
                    for (int il=0; il<5; il++) {
                        elnodes[il] = nodes[pyramid[el][il]];
                    }
                    int64_t index;
                    gmesh->CreateGeoElement(EPiramide, elnodes, MaterialId, index);
                    elnodes.resize(4);
                    for (int il=0; il<4; il++) {
                        elnodes[il] = nodes[tetraedra[el][il]];
                    }
                    gmesh->CreateGeoElement(ETetraedro, elnodes, MaterialId, index);
                }
            }
        }
    }
    gmesh->BuildConnectivity();
//    AddBoundaryElements(gmesh);
    AddBoundaryElementsByCoord(gmesh);
    if (fShouldDeform) {
        DeformGMesh(*gmesh);
    }
    return gmesh;
}